

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerTests.cpp
# Opt level: O1

void __thiscall agge::tests::RasterizerTests::RasterizerTests(RasterizerTests *this)

{
  registry *prVar1;
  
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)DrawingAFigureWillRenderItToABitmap,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)ClosingAPolygonDrawsLineToTheLastMoveToPoint,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)CoordinatesAreTranslatedAfterClipping,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)
                    CoordinatesTranslationAppliedForClippingWindow,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)ClippingResetIsDelegatedToClipper,(char *)0x0
            );
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)CoordinatesAreTranslatedBeforeClipping,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)
                    RasterizerDataCanBeAppendedByAnotherOfTheSameType,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::RasterizerTests>
            (prVar1,(offset_in_RasterizerTests_to_subr)AppendOffsetsAreAppliedAccordinglyToScale2,
             (char *)0x0);
  return;
}

Assistant:

test( DrawingAFigureWillRenderItToABitmap )
			{
				// INIT
				rasterizer< passthrough_clipper<real_t> > r1;
				rasterizer< passthrough_clipper<int> > r2;
				mocks::bitmap<uint8_t, 1, 1> bitmap1(6, 5);
				mocks::bitmap<uint8_t, 1, 1> bitmap1i(6, 5);
				mocks::bitmap<uint16_t, 1> bitmap2(7, 6);
				renderer r;

				// ACT
				r1.move_to(3.1f, 0.3f);
				r1.line_to(-2.422f, 2.705f);
				r1.line_to(6.43f, 6.72f);
				r1.line_to(3.1f, 0.3f);
				r1.sort();
				r(bitmap1, zero(), 0, r1, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r2.move_to(3.1f, 0.3f);
				r2.line_to(-2.422f, 2.705f);
				r2.line_to(6.43f, 6.72f);
				r2.line_to(3.1f, 0.3f);
				r2.sort();
				r(bitmap1i, zero(), 0, r2, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x00, 0x0e, 0x70, 0x31, 0x00, 0x00, 0x00,
					0x91, 0xf2, 0xff, 0xb8, 0x00, 0x00, 0x00,
					0xff, 0xff, 0xff, 0xff, 0x3d, 0x00, 0x00,
					0xf5, 0xff, 0xff, 0xff, 0xc2, 0x00, 0x00,
					0x12, 0x7c, 0xe8, 0xff, 0xff, 0x47, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, bitmap1.data);
				assert_equal(reference1, bitmap1i.data);

				// ACT
				r1.reset();
				r1.move_to(1.0f, 1.0f);
				r1.line_to(1.0f, 5.0f);
				r1.line_to(4.5f, 5.0f);
				r1.line_to(4.5f, 1.0f);
				r1.line_to(1.0f, 1.0f);
				r1.sort();
				r(bitmap2, zero(), 0, r1, mocks::blender<uint16_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint16_t reference2[] = {
					0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
					0x0000, 0x01FF, 0x01FF, 0x01FF, 0x0180, 0x0000, 0x0000, 0x0000,
					0x0000, 0x01FF, 0x01FF, 0x01FF, 0x0180, 0x0000, 0x0000, 0x0000,
					0x0000, 0x01FF, 0x01FF, 0x01FF, 0x0180, 0x0000, 0x0000, 0x0000,
					0x0000, 0x01FF, 0x01FF, 0x01FF, 0x0180, 0x0000, 0x0000, 0x0000,
					0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
				};

				assert_equal(reference2, bitmap2.data);
			}